

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# patch_title_screen.hpp
# Opt level: O2

void __thiscall PatchTitleScreen::inject_data(PatchTitleScreen *this,ROM *rom,World *world)

{
  uint32_t uVar1;
  allocator<char> local_31;
  string local_30;
  
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  uVar1 = md::ROM::inject_bytes(rom,TITLE1_TILES,0x741,&local_30);
  this->_title1_tiles_addr = uVar1;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  uVar1 = md::ROM::inject_bytes(rom,"%\x0e\x02\x05",0x6b,&local_30);
  this->_title1_layout_addr = uVar1;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  uVar1 = md::ROM::inject_bytes(rom,TITLE2_TILES,0x19b8,&local_30);
  this->_title2_tiles_addr = uVar1;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  uVar1 = md::ROM::inject_bytes(rom,"&\x10\x02_",0x54,&local_30);
  this->_title2_layout_addr = uVar1;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  uVar1 = md::ROM::inject_bytes(rom,TITLE3_TILES,0x2463,&local_30);
  this->_title3_tiles_addr = uVar1;
  std::__cxx11::string::~string((string *)&local_30);
  std::__cxx11::string::string<std::allocator<char>>((string *)&local_30,"",&local_31);
  uVar1 = md::ROM::inject_bytes(rom,TITLE3_LAYOUT,100,&local_30);
  this->_title3_layout_addr = uVar1;
  std::__cxx11::string::~string((string *)&local_30);
  return;
}

Assistant:

void inject_data(md::ROM& rom, World& world) override
    {
        _title1_tiles_addr = rom.inject_bytes(TITLE1_TILES, TITLE1_TILES_SIZE);
        _title1_layout_addr = rom.inject_bytes(TITLE1_LAYOUT, TITLE1_LAYOUT_SIZE);
        _title2_tiles_addr = rom.inject_bytes(TITLE2_TILES, TITLE2_TILES_SIZE);
        _title2_layout_addr = rom.inject_bytes(TITLE2_LAYOUT, TITLE2_LAYOUT_SIZE);
        _title3_tiles_addr = rom.inject_bytes(TITLE3_TILES, TITLE3_TILES_SIZE);
        _title3_layout_addr = rom.inject_bytes(TITLE3_LAYOUT, TITLE3_LAYOUT_SIZE);
    }